

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

void findloader(lua_State *L,char *name)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_2040 [8];
  luaL_Buffer msg;
  int i;
  char *name_local;
  lua_State *L_local;
  
  luaL_buffinit(L,(luaL_Buffer *)local_2040);
  iVar1 = lua_getfield(L,-0xf4629,"searchers");
  if (iVar1 != 5) {
    luaL_error(L,"\'package.searchers\' must be a table");
  }
  msg.initb[0x1ffc] = '\x01';
  msg.initb[0x1ffd] = '\0';
  msg.initb[0x1ffe] = '\0';
  msg.initb[0x1fff] = '\0';
  while( true ) {
    iVar1 = lua_rawgeti(L,3,(long)(int)msg.initb._8188_4_);
    if (iVar1 == 0) {
      lua_settop(L,-2);
      luaL_pushresult((luaL_Buffer *)local_2040);
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      luaL_error(L,"module \'%s\' not found:%s",name,pcVar2);
    }
    lua_pushstring(L,name);
    lua_callk(L,1,2,0,(lua_KFunction)0x0);
    iVar1 = lua_type(L,-2);
    if (iVar1 == 6) break;
    iVar1 = lua_isstring(L,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      lua_settop(L,-2);
      luaL_addvalue((luaL_Buffer *)local_2040);
    }
    msg.initb._8188_4_ = msg.initb._8188_4_ + 1;
  }
  return;
}

Assistant:

static void findloader (lua_State *L, const char *name) {
  int i;
  luaL_Buffer msg;  /* to build error message */
  luaL_buffinit(L, &msg);
  /* push 'package.searchers' to index 3 in the stack */
  if (lua_getfield(L, lua_upvalueindex(1), "searchers") != LUA_TTABLE)
    luaL_error(L, "'package.searchers' must be a table");
  /*  iterate over available searchers to find a loader */
  for (i = 1; ; i++) {
    if (lua_rawgeti(L, 3, i) == LUA_TNIL) {  /* no more searchers? */
      lua_pop(L, 1);  /* remove nil */
      luaL_pushresult(&msg);  /* create error message */
      luaL_error(L, "module '%s' not found:%s", name, lua_tostring(L, -1));
    }
    lua_pushstring(L, name);
    lua_call(L, 1, 2);  /* call it */
    if (lua_isfunction(L, -2))  /* did it find a loader? */
      return;  /* module loader found */
    else if (lua_isstring(L, -2)) {  /* searcher returned error message? */
      lua_pop(L, 1);  /* remove extra return */
      luaL_addvalue(&msg);  /* concatenate error message */
    }
    else
      lua_pop(L, 2);  /* remove both returns */
  }
}